

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

long __thiscall
cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
::fill_internal_output
          (cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
           *this,short *input_buffer,long *input_frames_count,short *output_buffer,
          long output_frames_needed)

{
  uint32_t uVar1;
  ulong frame_count;
  size_t sVar2;
  long in_RDI;
  cubeb_resampler_speex_one_way<short> *in_R8;
  long output_frames_before_processing;
  short *out_unprocessed;
  long got;
  cubeb_resampler_speex_one_way<short> *in_stack_ffffffffffffffc0;
  cubeb_resampler_speex_one_way<short> *this_00;
  short *in_stack_ffffffffffffffc8;
  cubeb_resampler_speex_one_way<short> *this_01;
  
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    this_01 = (cubeb_resampler_speex_one_way<short> *)0x0;
    this_00 = (cubeb_resampler_speex_one_way<short> *)0x0;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                  *)0x11756a);
    uVar1 = cubeb_resampler_speex_one_way<short>::input_needed_for_output
                      (this_01,(int32_t)((ulong)this_00 >> 0x20));
    frame_count = (ulong)uVar1;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                  *)0x11758e);
    in_stack_ffffffffffffffc0 =
         (cubeb_resampler_speex_one_way<short> *)
         cubeb_resampler_speex_one_way<short>::input_buffer(this_00,frame_count);
    in_stack_ffffffffffffffc8 =
         (short *)(**(code **)(in_RDI + 0x30))
                            (*(undefined8 *)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x38),0,
                             in_stack_ffffffffffffffc0,frame_count);
    if (((long)in_stack_ffffffffffffffc8 < (long)frame_count) &&
       (*(undefined1 *)(in_RDI + 0x40) = 1, (long)in_stack_ffffffffffffffc8 < 0)) {
      return (long)in_stack_ffffffffffffffc8;
    }
    std::
    unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                  *)0x1175fd);
    cubeb_resampler_speex_one_way<short>::written(in_stack_ffffffffffffffc0,frame_count);
  }
  std::
  unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                *)0x117618);
  sVar2 = cubeb_resampler_speex_one_way<short>::output
                    (in_R8,in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
  return sVar2;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_output(
    T * input_buffer, long * input_frames_count, T * output_buffer,
    long output_frames_needed)
{
  assert(!input_buffer && (!input_frames_count || *input_frames_count == 0) &&
         output_buffer && output_frames_needed);

  if (!draining) {
    long got = 0;
    T * out_unprocessed = nullptr;
    long output_frames_before_processing = 0;

    /* fill directly the input buffer of the output processor to save a copy */
    output_frames_before_processing =
        output_processor->input_needed_for_output(output_frames_needed);

    out_unprocessed =
        output_processor->input_buffer(output_frames_before_processing);

    got = data_callback(stream, user_ptr, nullptr, out_unprocessed,
                        output_frames_before_processing);

    if (got < output_frames_before_processing) {
      draining = true;

      if (got < 0) {
        return got;
      }
    }

    output_processor->written(got);
  }

  /* Process the output. If not enough frames have been returned from the
   * callback, drain the processors. */
  return output_processor->output(output_buffer, output_frames_needed);
}